

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinespace.h
# Opt level: O3

void __thiscall
embree::SceneGraph::PerspectiveCameraData::PerspectiveCameraData
          (PerspectiveCameraData *this,PerspectiveCameraData *other,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = (other->from).field_0.m128[0];
  fVar2 = (other->from).field_0.m128[1];
  fVar3 = (other->from).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[1];
  fVar5 = (space->l).vz.field_0.m128[2];
  fVar6 = (space->l).vz.field_0.m128[3];
  fVar7 = (space->p).field_0.m128[1];
  fVar8 = (space->p).field_0.m128[2];
  fVar9 = (space->p).field_0.m128[3];
  fVar10 = (space->l).vy.field_0.m128[1];
  fVar11 = (space->l).vy.field_0.m128[2];
  fVar12 = (space->l).vy.field_0.m128[3];
  fVar13 = (space->l).vx.field_0.m128[1];
  fVar14 = (space->l).vx.field_0.m128[2];
  fVar15 = (space->l).vx.field_0.m128[3];
  (this->from).field_0.m128[0] =
       fVar1 * (space->l).vx.field_0.m128[0] +
       fVar2 * (space->l).vy.field_0.m128[0] +
       fVar3 * (space->l).vz.field_0.m128[0] + (space->p).field_0.m128[0];
  (this->from).field_0.m128[1] = fVar1 * fVar13 + fVar2 * fVar10 + fVar3 * fVar4 + fVar7;
  (this->from).field_0.m128[2] = fVar1 * fVar14 + fVar2 * fVar11 + fVar3 * fVar5 + fVar8;
  (this->from).field_0.m128[3] = fVar1 * fVar15 + fVar2 * fVar12 + fVar3 * fVar6 + fVar9;
  fVar1 = (other->to).field_0.m128[0];
  fVar2 = (other->to).field_0.m128[1];
  fVar3 = (other->to).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[1];
  fVar5 = (space->l).vz.field_0.m128[2];
  fVar6 = (space->l).vz.field_0.m128[3];
  fVar7 = (space->p).field_0.m128[1];
  fVar8 = (space->p).field_0.m128[2];
  fVar9 = (space->p).field_0.m128[3];
  fVar10 = (space->l).vy.field_0.m128[1];
  fVar11 = (space->l).vy.field_0.m128[2];
  fVar12 = (space->l).vy.field_0.m128[3];
  fVar13 = (space->l).vx.field_0.m128[1];
  fVar14 = (space->l).vx.field_0.m128[2];
  fVar15 = (space->l).vx.field_0.m128[3];
  (this->to).field_0.m128[0] =
       fVar1 * (space->l).vx.field_0.m128[0] +
       fVar2 * (space->l).vy.field_0.m128[0] +
       fVar3 * (space->l).vz.field_0.m128[0] + (space->p).field_0.m128[0];
  (this->to).field_0.m128[1] = fVar1 * fVar13 + fVar2 * fVar10 + fVar3 * fVar4 + fVar7;
  (this->to).field_0.m128[2] = fVar1 * fVar14 + fVar2 * fVar11 + fVar3 * fVar5 + fVar8;
  (this->to).field_0.m128[3] = fVar1 * fVar15 + fVar2 * fVar12 + fVar3 * fVar6 + fVar9;
  fVar1 = (other->up).field_0.m128[0];
  fVar2 = (other->up).field_0.m128[1];
  fVar3 = (other->up).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[1];
  fVar5 = (space->l).vz.field_0.m128[2];
  fVar6 = (space->l).vz.field_0.m128[3];
  fVar7 = (space->l).vy.field_0.m128[1];
  fVar8 = (space->l).vy.field_0.m128[2];
  fVar9 = (space->l).vy.field_0.m128[3];
  fVar10 = (space->l).vx.field_0.m128[1];
  fVar11 = (space->l).vx.field_0.m128[2];
  fVar12 = (space->l).vx.field_0.m128[3];
  (this->up).field_0.m128[0] =
       fVar1 * (space->l).vx.field_0.m128[0] +
       fVar2 * (space->l).vy.field_0.m128[0] + fVar3 * (space->l).vz.field_0.m128[0];
  (this->up).field_0.m128[1] = fVar1 * fVar10 + fVar2 * fVar7 + fVar3 * fVar4;
  (this->up).field_0.m128[2] = fVar1 * fVar11 + fVar2 * fVar8 + fVar3 * fVar5;
  (this->up).field_0.m128[3] = fVar1 * fVar12 + fVar2 * fVar9 + fVar3 * fVar6;
  this->fov = other->fov;
  return;
}

Assistant:

__forceinline VectorT xfmNormal(const AffineSpaceT<L>& m, const VectorT& n) { return xfmNormal(m.l,n); }